

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall
AixLog::SinkFormat::do_log(SinkFormat *this,ostream *stream,Metadata *metadata,string *message)

{
  ulong uVar1;
  ostream *poVar2;
  Severity logSeverity;
  Severity logSeverity_00;
  long lStack_210;
  string result;
  string local_1e8;
  TextColor local_1c8;
  TextColor local_1c0;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::string::string((string *)&result,(string *)&this->format_);
  if ((metadata->timestamp).is_null_ == false) {
    Timestamp::to_string((string *)&ss,&metadata->timestamp,&result);
    std::__cxx11::string::operator=((string *)&result,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
  }
  uVar1 = std::__cxx11::string::find((char *)&result,0x191595);
  if (uVar1 != 0xffffffffffffffff) {
    to_string_abi_cxx11_
              ((string *)&ss,(AixLog *)(ulong)(uint)(int)(char)metadata->severity,logSeverity);
    std::__cxx11::string::replace((ulong)&result,uVar1,(string *)0x9);
    std::__cxx11::string::~string((string *)&ss);
  }
  uVar1 = std::__cxx11::string::find((char *)&result,0x19159f);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    local_1c0.foreground = RED;
    local_1c0.background = NONE;
    AixLog::operator<<(local_1a8,&local_1c0);
    to_string_abi_cxx11_
              (&local_1e8,(AixLog *)(ulong)(uint)(int)(char)metadata->severity,logSeverity_00);
    poVar2 = std::operator<<(local_1a8,(string *)&local_1e8);
    local_1c8.foreground = NONE;
    local_1c8.background = NONE;
    AixLog::operator<<(poVar2,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)&result,uVar1,(string *)0xf);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  uVar1 = std::__cxx11::string::find((char *)&result,0x1915af);
  if (uVar1 == 0xffffffffffffffff) goto LAB_0013e520;
  if ((metadata->tag).is_null_ == true) {
    if ((metadata->function).is_null_ == false) {
      lStack_210 = 0x40;
      goto LAB_0013e4f0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"log",(allocator<char> *)&local_1e8);
  }
  else {
    lStack_210 = 0x10;
LAB_0013e4f0:
    std::__cxx11::string::string((string *)&ss,(string *)(&metadata->severity + lStack_210));
  }
  std::__cxx11::string::replace((ulong)&result,uVar1,(string *)0x9);
  std::__cxx11::string::~string((string *)&ss);
LAB_0013e520:
  uVar1 = std::__cxx11::string::find((char *)&result,0x1915b9);
  if (uVar1 != 0xffffffffffffffff) {
    if ((metadata->tag).is_null_ == false) {
      std::__cxx11::string::string((string *)&ss,(string *)&(metadata->tag).text);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"",(allocator<char> *)&local_1c0);
    }
    std::__cxx11::string::replace((ulong)&result,uVar1,(string *)0x4);
    std::__cxx11::string::~string((string *)&ss);
  }
  uVar1 = std::__cxx11::string::find((char *)&result,0x1915be);
  if (uVar1 != 0xffffffffffffffff) {
    if ((metadata->function).is_null_ == false) {
      std::__cxx11::string::string((string *)&ss,(string *)&(metadata->function).name);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"",(allocator<char> *)&local_1c8);
    }
    std::__cxx11::string::replace((ulong)&result,uVar1,(string *)0x9);
    std::__cxx11::string::~string((string *)&ss);
  }
  uVar1 = std::__cxx11::string::find((char *)&result,0x1915c8);
  if (uVar1 == 0xffffffffffffffff) {
    if ((result._M_string_length == 0) ||
       (result._M_dataplus._M_p[result._M_string_length - 1] == ' ')) {
      stream = std::operator<<(stream,(string *)&result);
    }
    else {
      poVar2 = std::operator<<(stream,(string *)&result);
      stream = std::operator<<(poVar2," ");
    }
  }
  else {
    std::__cxx11::string::replace((ulong)&result,uVar1,(string *)0x8);
    message = &result;
  }
  poVar2 = std::operator<<(stream,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

virtual void do_log(std::ostream& stream, const Metadata& metadata,
                      const std::string& message) const {
    std::string result = format_;
    if (metadata.timestamp) result = metadata.timestamp.to_string(result);

    size_t pos = result.find("#severity");
    if (pos != std::string::npos)
      result.replace(pos, 9, to_string(metadata.severity));

    pos = result.find("#color_severity");
    if (pos != std::string::npos) {
      std::stringstream ss;
      ss << TextColor(Color::RED) << to_string(metadata.severity)
         << TextColor(Color::NONE);
      result.replace(pos, 15, ss.str());
    }

    pos = result.find("#tag_func");
    if (pos != std::string::npos)
      result.replace(
          pos, 9,
          metadata.tag ? metadata.tag.text
                       : (metadata.function ? metadata.function.name : "log"));

    pos = result.find("#tag");
    if (pos != std::string::npos)
      result.replace(pos, 4, metadata.tag ? metadata.tag.text : "");

    pos = result.find("#function");
    if (pos != std::string::npos)
      result.replace(pos, 9, metadata.function ? metadata.function.name : "");

    pos = result.find("#message");
    if (pos != std::string::npos) {
      result.replace(pos, 8, message);
      stream << result << std::endl;
    } else {
      if (result.empty() || (result.back() == ' '))
        stream << result << message << std::endl;
      else
        stream << result << " " << message << std::endl;
    }
  }